

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpk.c
# Opt level: O3

void XPK_Free(XPK *xpk)

{
  ulong uVar1;
  
  if ((FILE *)xpk->file != (FILE *)0x0) {
    fclose((FILE *)xpk->file);
  }
  if (xpk->n_entries != 0) {
    uVar1 = 0;
    do {
      free(xpk->entries[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < xpk->n_entries);
  }
  CLU_Free(xpk->clu);
  free(xpk);
  return;
}

Assistant:

void
XPK_Free(XPK *xpk)
{
	if (xpk->file) fclose(xpk->file);
	for (int i = 0; i < xpk->n_entries; i++) {
		XPKEntry_Free(xpk->entries[i]);
	}
	CLU_Free(xpk->clu);
	free(xpk);
}